

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unittest_embed_optimize_for.pb.cc
# Opt level: O3

bool proto2_unittest::TestEmbedOptimizedForSize::IsInitializedImpl(MessageLite *msg)

{
  bool bVar1;
  
  bVar1 = google::protobuf::internal::AllAreInitialized<proto2_unittest::TestOptimizedForSize>
                    ((RepeatedPtrField<proto2_unittest::TestOptimizedForSize> *)
                     &msg[1]._internal_metadata_);
  if (bVar1) {
    if (((ulong)msg[1]._vptr_MessageLite & 1) != 0) {
      bVar1 = google::protobuf::MessageLite::IsInitialized((MessageLite *)msg[3]._vptr_MessageLite);
      if (!bVar1) goto LAB_00cd1d4c;
    }
    bVar1 = true;
  }
  else {
LAB_00cd1d4c:
    bVar1 = false;
  }
  return bVar1;
}

Assistant:

PROTOBUF_NOINLINE bool TestEmbedOptimizedForSize::IsInitializedImpl(
    const MessageLite& msg) {
  auto& this_ = static_cast<const TestEmbedOptimizedForSize&>(msg);
  if (!::google::protobuf::internal::AllAreInitialized(this_._internal_repeated_message()))
    return false;
  if ((this_._impl_._has_bits_[0] & 0x00000001u) != 0) {
    if (!this_._impl_.optional_message_->IsInitialized()) return false;
  }
  return true;
}